

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.h
# Opt level: O0

void __thiscall TrodesMsg::addcontents<char_const*>(TrodesMsg *this,string *f,char *head)

{
  ulong uVar1;
  string *this_00;
  TrodesMsg *this_01;
  string *in_RDX;
  ulong in_RSI;
  TrodesMsg *in_RDI;
  string e;
  allocator *paVar2;
  string local_78;
  allocator local_51;
  string local_50 [35];
  undefined1 local_2d;
  allocator local_19;
  string *local_18;
  
  local_18 = in_RDX;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this_01 = (TrodesMsg *)std::__cxx11::string::operator[](in_RSI);
    paVar2 = &local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,(char *)local_18,paVar2);
    appendArg(this_01,(char)((ulong)paVar2 >> 0x38),local_18);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    std::__cxx11::string::operator[](in_RSI);
    std::__cxx11::string::push_back((char)in_RDI);
    std::__cxx11::string::substr((ulong)&local_78,in_RSI);
    addcontents(in_RDI,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    return;
  }
  local_2d = 1;
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (this_00,"TrodesMsg Error: Mismatched format string and variables",&local_19);
  local_2d = 0;
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void addcontents(std::string f, H head, T... tail){
        try{
            if(f.empty())
                throw std::string("TrodesMsg Error: Mismatched format string and variables");
            appendArg(f[0], head);
            format.push_back(f[0]);
            addcontents(f.substr(1), tail...);
        } catch(std::string e){
            std::cerr << "[TrodesMsg::addcontents Error] " << e << "\n";
        } catch(...){
            std::cout << "[TrodesMsg::addcontents Error] Unknown exception thrown!\n";
        }
    }